

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O0

void __thiscall raspicam::_private::Private_Impl_Still::commitFlips(Private_Impl_Still *this)

{
  MMAL_STATUS_T MVar1;
  ostream *poVar2;
  long *in_RDI;
  MMAL_PARAMETER_MIRROR_T mirror;
  MMAL_PARAMETER_HEADER_T local_14;
  uint local_c;
  
  local_14.id = 0x1000f;
  local_14.size = 0xc;
  if (((*(byte *)((long)in_RDI + 0x71) & 1) == 0) || ((*(byte *)((long)in_RDI + 0x72) & 1) == 0)) {
    if ((*(byte *)((long)in_RDI + 0x71) & 1) == 0) {
      local_c = (uint)((*(byte *)((long)in_RDI + 0x72) & 1) != 0);
    }
    else {
      local_c = 2;
    }
  }
  else {
    local_c = 3;
  }
  MVar1 = mmal_port_parameter_set((MMAL_PORT_T *)**(undefined8 **)(*in_RDI + 0x40),&local_14);
  if (((MVar1 != MMAL_SUCCESS) ||
      (MVar1 = mmal_port_parameter_set(*(MMAL_PORT_T **)(*(long *)(*in_RDI + 0x40) + 8),&local_14),
      MVar1 != MMAL_SUCCESS)) ||
     (MVar1 = mmal_port_parameter_set(*(MMAL_PORT_T **)(*(long *)(*in_RDI + 0x40) + 0x10),&local_14)
     , MVar1 != MMAL_SUCCESS)) {
    poVar2 = std::operator<<((ostream *)&std::cout,(char *)in_RDI[0xf]);
    std::operator<<(poVar2,": Failed to set horizontal/vertical flip parameter.\n");
  }
  return;
}

Assistant:

void Private_Impl_Still::commitFlips() {
            MMAL_PARAMETER_MIRROR_T mirror = {{MMAL_PARAMETER_MIRROR, sizeof ( MMAL_PARAMETER_MIRROR_T ) }, MMAL_PARAM_MIRROR_NONE};
            if ( horizontalFlip && verticalFlip )
                mirror.value = MMAL_PARAM_MIRROR_BOTH;
            else if ( horizontalFlip )
                mirror.value = MMAL_PARAM_MIRROR_HORIZONTAL;
            else if ( verticalFlip )
                mirror.value = MMAL_PARAM_MIRROR_VERTICAL;
            if ( mmal_port_parameter_set ( camera->output[0], &mirror.hdr ) != MMAL_SUCCESS ||
                    mmal_port_parameter_set ( camera->output[1], &mirror.hdr ) != MMAL_SUCCESS ||
                    mmal_port_parameter_set ( camera->output[2], &mirror.hdr ) )
                cout << API_NAME << ": Failed to set horizontal/vertical flip parameter.\n";
        }